

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_from_curvature(REF_DBL *metric,REF_GRID ref_grid)

{
  double dVar1;
  int iVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT *pRVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  char *pcVar9;
  REF_INT RVar10;
  long lVar11;
  REF_DBL *m;
  double dVar12;
  REF_DBL hmax;
  REF_DBL slop;
  REF_DBL hr;
  REF_GRID local_1a0;
  double local_198;
  REF_DBL *local_190;
  REF_DBL delta_radian;
  double local_180;
  REF_DBL hs;
  double local_170;
  REF_DBL crease_dot_prod;
  double local_160;
  REF_DBL r [3];
  REF_DBL s [3];
  double local_118;
  double local_110;
  double local_108;
  REF_DBL local_100 [9];
  double local_b8 [4];
  REF_DBL curvature_metric [6];
  REF_DBL previous_metric [6];
  
  ref_node = ref_grid->node;
  ref_geom = ref_grid->geom;
  hmax = 1e+200;
  local_1a0 = ref_grid;
  local_190 = metric;
  if (ref_geom->model == (void *)0x0) {
    if (ref_geom->meshlink == (void *)0x0) {
      puts("\nNo geometry model, did you forget to load it?\n");
      pcVar9 = "...or implement non-CAD curvature estimate";
      uVar5 = 6;
      uVar8 = 0x53b;
      goto LAB_0018c201;
    }
    uVar5 = ref_node_bounding_box_diagonal(ref_node,&hmax);
    if (uVar5 != 0) {
      pcVar9 = "bbox diag";
      uVar8 = 0x538;
      goto LAB_0018c201;
    }
  }
  else {
    uVar5 = ref_egads_diagonal(ref_geom,-1,&hmax);
    if (uVar5 != 0) {
      pcVar9 = "egads bbox diag";
      uVar8 = 0x536;
      goto LAB_0018c201;
    }
  }
  dVar12 = 1.0;
  if (1.0 <= ref_geom->segments_per_bounding_box_diagonal) {
    dVar12 = ref_geom->segments_per_bounding_box_diagonal;
  }
  hmax = hmax / dVar12;
  for (lVar11 = 0; lVar11 < ref_node->max; lVar11 = lVar11 + 1) {
    if ((-1 < ref_node->global[lVar11]) && (ref_node->ref_mpi->id == ref_node->part[lVar11])) {
      if (ref_geom->model == (void *)0x0) {
        dVar12 = (1.0 / hmax) / hmax;
        local_190[lVar11 * 6] = dVar12;
        local_190[lVar11 * 6 + 1] = 0.0;
        (local_190 + lVar11 * 6 + 1)[1] = 0.0;
        local_190[lVar11 * 6 + 3] = dVar12;
        local_190[lVar11 * 6 + 4] = 0.0;
        local_190[lVar11 * 6 + 5] = dVar12;
      }
      else {
        uVar5 = ref_egads_feature_size(local_1a0,(REF_INT)lVar11,&hr,r,&hs,s,&local_170,local_b8);
        if (uVar5 != 0) {
          pcVar9 = "feature size";
          uVar8 = 0x54b;
          goto LAB_0018c201;
        }
        if (hr * 20.0 <= hs) {
          hs = hr * 20.0;
        }
        if (hr + hr <= local_170) {
          local_170 = hr + hr;
        }
        if (hs + hs <= local_170) {
          local_170 = hs + hs;
        }
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          local_100[lVar6] = r[lVar6];
        }
        local_118 = (1.0 / hr) / hr;
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          local_100[lVar6 + 3] = s[lVar6];
        }
        local_110 = (1.0 / hs) / hs;
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          local_100[lVar6 + 6] = local_b8[lVar6];
        }
        local_108 = (1.0 / local_170) / local_170;
        uVar5 = ref_matrix_form_m(&local_118,local_190 + lVar11 * 6);
        if (uVar5 != 0) {
          pcVar9 = "form m";
          uVar8 = 0x555;
          goto LAB_0018c201;
        }
      }
    }
  }
  for (lVar11 = 0; uVar7 = (ulong)ref_geom->max, lVar11 < (long)uVar7; lVar11 = lVar11 + 1) {
    pRVar4 = ref_geom->descr;
    if ((pRVar4[lVar11 * 6] == 2) &&
       (iVar2 = pRVar4[lVar11 * 6 + 5], ref_node->ref_mpi->id == ref_node->part[iVar2])) {
      iVar3 = pRVar4[lVar11 * 6 + 1];
      RVar10 = (REF_INT)lVar11;
      uVar5 = ref_geom_radian_request(ref_geom,RVar10,&delta_radian);
      if (uVar5 != 0) {
        pcVar9 = "drad";
        uVar8 = 0x565;
        goto LAB_0018c201;
      }
      if (ref_geom->model == (void *)0x0) {
        if (ref_geom->meshlink == (void *)0x0) goto LAB_0018bb04;
        local_180 = hmax / delta_radian;
        uVar5 = ref_meshlink_face_curvature(local_1a0,RVar10,&local_198,r,&local_160,s);
        if (uVar5 != 0) {
          pcVar9 = "curve";
          uVar8 = 0x56c;
          goto LAB_0018c201;
        }
      }
      else {
        local_180 = hmax / delta_radian;
        uVar5 = ref_egads_face_curvature(ref_geom,RVar10,&local_198,r,&local_160,s);
        if (1 < uVar5) {
          pcVar9 = "curve";
          uVar8 = 0x569;
          goto LAB_0018c201;
        }
      }
      if (local_198 <= -local_198) {
        local_198 = -local_198;
      }
      if (local_160 <= -local_160) {
        local_160 = -local_160;
      }
      if (local_198 <= local_160 * 0.05) {
        local_198 = local_160 * 0.05;
      }
      if (local_160 <= local_198 * 0.05) {
        local_160 = local_198 * 0.05;
      }
      hr = hmax;
      if (1.0 / local_180 < local_198) {
        hr = delta_radian / local_198;
      }
      hs = hmax;
      if (1.0 / local_180 < local_160) {
        hs = delta_radian / local_160;
      }
      if (ref_geom->model == (void *)0x0) {
        if (ref_geom->meshlink == (void *)0x0) {
          slop = hmax * 1e-05;
        }
        else {
          uVar5 = ref_meshlink_gap(local_1a0,iVar2,&slop);
          if (uVar5 != 0) {
            pcVar9 = "edge tol";
            uVar8 = 0x581;
            goto LAB_0018c201;
          }
          slop = ref_geom->gap_protection * slop;
        }
      }
      else {
        uVar5 = ref_geom_usable(ref_geom,RVar10,(REF_BOOL *)&crease_dot_prod);
        if (uVar5 != 0) {
          pcVar9 = "useable curvature";
          uVar8 = 0x57d;
          goto LAB_0018c201;
        }
        if (crease_dot_prod._0_4_ == 0) goto LAB_0018bb04;
        uVar5 = ref_geom_reliability(ref_geom,RVar10,&slop);
        if (uVar5 != 0) {
          pcVar9 = "edge tol";
          uVar8 = 0x57f;
          goto LAB_0018c201;
        }
      }
      if ((slop <= hr) && (slop <= hs)) {
        dVar12 = hmax;
        if ((0 < iVar3) && (iVar3 <= ref_geom->nface)) {
          if (((ref_geom->face_min_length != (REF_DBL *)0x0) &&
              (dVar1 = ref_geom->face_min_length[iVar3 - 1U], 0.0 < dVar1)) &&
             ((hr < dVar1 || (hs < dVar1)))) goto LAB_0018bb04;
          if ((ref_geom->initial_cell_height != (REF_DBL *)0x0) &&
             (dVar1 = ref_geom->initial_cell_height[iVar3 - 1U], 0.0 < dVar1)) {
            dVar12 = dVar1;
          }
        }
        if (hr + hr <= dVar12) {
          dVar12 = hr + hr;
        }
        local_170 = dVar12;
        if (hs + hs <= dVar12) {
          local_170 = hs + hs;
        }
        local_b8[0] = s[2] * r[1] - r[2] * s[1];
        local_b8[1] = s[0] * r[2] - r[0] * s[2];
        local_b8[2] = r[0] * s[1] - s[0] * r[1];
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          local_100[lVar6] = r[lVar6];
        }
        local_118 = (1.0 / hr) / hr;
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          local_100[lVar6 + 3] = s[lVar6];
        }
        local_110 = (1.0 / hs) / hs;
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          local_100[lVar6 + 6] = local_b8[lVar6];
        }
        local_108 = (1.0 / local_170) / local_170;
        uVar5 = ref_matrix_form_m(&local_118,curvature_metric);
        if (uVar5 != 0) {
          pcVar9 = "reform m";
          uVar8 = 0x59c;
          goto LAB_0018c201;
        }
        for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
          previous_metric[lVar6] = (local_190 + iVar2 * 6)[lVar6];
        }
        uVar5 = ref_matrix_intersect(previous_metric,curvature_metric,local_190 + iVar2 * 6);
        if (uVar5 != 0) {
          pcVar9 = "intersect to update metric";
          uVar8 = 0x5a0;
          goto LAB_0018c201;
        }
      }
    }
LAB_0018bb04:
  }
  for (lVar11 = 0; lVar11 < (int)uVar7; lVar11 = lVar11 + 1) {
    if ((ref_geom->descr[lVar11 * 6] == 1) &&
       (iVar2 = ref_geom->descr[lVar11 * 6 + 5], ref_node->ref_mpi->id == ref_node->part[iVar2])) {
      RVar10 = (REF_INT)lVar11;
      uVar5 = ref_geom_radian_request(ref_geom,RVar10,&delta_radian);
      if (uVar5 != 0) {
        pcVar9 = "drad";
        uVar8 = 0x5a7;
        goto LAB_0018c201;
      }
      if (ref_geom->model == (void *)0x0) {
        if (ref_geom->meshlink == (void *)0x0) goto LAB_0018be71;
        local_180 = hmax / delta_radian;
        uVar5 = ref_meshlink_edge_curvature(local_1a0,RVar10,&local_198,r);
        if (uVar5 != 0) {
          pcVar9 = "curve";
          uVar8 = 0x5ac;
          goto LAB_0018c201;
        }
      }
      else {
        local_180 = hmax / delta_radian;
        uVar5 = ref_egads_edge_curvature(ref_geom,RVar10,&local_198,r);
        if (uVar5 != 0) {
          pcVar9 = "curve";
          uVar8 = 0x5aa;
          goto LAB_0018c201;
        }
      }
      if (local_198 <= -local_198) {
        local_198 = -local_198;
      }
      hr = hmax;
      if (1.0 / local_180 < local_198) {
        hr = delta_radian / local_198;
      }
      if (ref_geom->model == (void *)0x0) {
        if (ref_geom->meshlink == (void *)0x0) {
          slop = hmax * 1e-05;
        }
        else {
          uVar5 = ref_meshlink_gap(local_1a0,iVar2,&slop);
          if (uVar5 != 0) {
            pcVar9 = "edge tol";
            uVar8 = 0x5b8;
            goto LAB_0018c201;
          }
          slop = ref_geom->gap_protection * slop;
        }
      }
      else {
        uVar5 = ref_geom_reliability(ref_geom,RVar10,&slop);
        if (uVar5 != 0) {
          pcVar9 = "edge tol";
          uVar8 = 0x5b6;
          goto LAB_0018c201;
        }
      }
      if (slop <= hr) {
        if (ref_geom->model != (void *)0x0) {
          uVar5 = ref_geom_crease(local_1a0,iVar2,&crease_dot_prod);
          if (uVar5 != 0) {
            pcVar9 = "crease";
            uVar8 = 0x5c0;
            goto LAB_0018c201;
          }
          if ((double)CONCAT44(crease_dot_prod._4_4_,crease_dot_prod._0_4_) < -0.8) {
            dVar12 = (-0.8 - (double)CONCAT44(crease_dot_prod._4_4_,crease_dot_prod._0_4_)) / 0.2;
            hr = hr * (dVar12 * 0.25 + (1.0 - dVar12));
          }
        }
        local_100[0] = 1.0;
        local_118 = (1.0 / hr) / hr;
        local_100[1] = 0.0;
        local_100[2] = 0.0;
        local_100[3] = 0.0;
        local_100[4] = 1.0;
        local_100[5] = 0.0;
        local_100[6] = 0.0;
        local_100[7] = 0.0;
        local_100[8] = 1.0;
        local_110 = local_118;
        local_108 = local_118;
        uVar5 = ref_matrix_form_m(&local_118,curvature_metric);
        if (uVar5 != 0) {
          pcVar9 = "reform m";
          uVar8 = 0x5d8;
          goto LAB_0018c201;
        }
        for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
          previous_metric[lVar6] = (local_190 + iVar2 * 6)[lVar6];
        }
        uVar5 = ref_matrix_intersect(previous_metric,curvature_metric,local_190 + iVar2 * 6);
        if (uVar5 != 0) {
          pcVar9 = "intersect to update metric";
          uVar8 = 0x5dc;
          goto LAB_0018c201;
        }
      }
    }
LAB_0018be71:
    uVar7 = (ulong)(uint)ref_geom->max;
  }
  if (local_1a0->twod != 0) {
    m = local_190;
    for (lVar11 = 0; lVar11 < ref_node->max; lVar11 = lVar11 + 1) {
      if (((-1 < ref_node->global[lVar11]) && (ref_node->ref_mpi->id == ref_node->part[lVar11])) &&
         (uVar5 = ref_matrix_twod_m(m), uVar5 != 0)) {
        pcVar9 = "enforce twod";
        uVar8 = 0x5e3;
        goto LAB_0018c201;
      }
      m = m + 6;
    }
  }
  uVar5 = ref_node_ghost_dbl(ref_node,local_190,6);
  if (uVar5 == 0) {
    return 0;
  }
  pcVar9 = "update ghosts";
  uVar8 = 0x5e8;
LAB_0018c201:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar8,
         "ref_metric_from_curvature",(ulong)uVar5,pcVar9);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_metric_from_curvature(REF_DBL *metric,
                                             REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom, node, face;
  REF_DBL kr, r[3], ks, s[3], n[3];
  REF_DBL diagonal_system[12];
  REF_DBL previous_metric[6], curvature_metric[6];
  REF_INT i;
  REF_DBL delta_radian; /* 1/segments per radian */
  REF_DBL hmax = REF_DBL_MAX;
  REF_DBL rlimit;
  REF_DBL hr, hs, hn, slop;
  REF_DBL aspect_ratio, curvature_ratio, norm_ratio;
  REF_DBL crease_dot_prod, ramp, scale;

  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_diagonal(ref_geom, REF_EMPTY, &hmax), "egads bbox diag");
  } else if (ref_geom_meshlinked(ref_geom)) {
    RSS(ref_node_bounding_box_diagonal(ref_node, &hmax), "bbox diag");
  } else {
    printf("\nNo geometry model, did you forget to load it?\n\n");
    RSS(REF_IMPLEMENT, "...or implement non-CAD curvature estimate");
  }
  /* normal spacing and max tangential spacing */
  hmax /= MAX(1.0, ref_geom_segments_per_bounding_box_diagonal(ref_geom));

  /* limit aspect ratio via curvature */
  aspect_ratio = 20.0;
  curvature_ratio = 1.0 / aspect_ratio;

  /* limit normal direction to a factor of surface spacing */
  norm_ratio = 2.0;

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_egads_feature_size(ref_grid, node, &hr, r, &hs, s, &hn, n),
            "feature size");
        hs = MIN(hs, hr * aspect_ratio);
        hn = MIN(hn, norm_ratio * hr);
        hn = MIN(hn, norm_ratio * hs);
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 0) = r[i];
        ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 1) = s[i];
        ref_matrix_eig(diagonal_system, 1) = 1.0 / hs / hs;
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 2) = n[i];
        ref_matrix_eig(diagonal_system, 2) = 1.0 / hn / hn;
        RSS(ref_matrix_form_m(diagonal_system, &(metric[6 * node])), "form m");
      } else {
        metric[0 + 6 * node] = 1.0 / hmax / hmax;
        metric[1 + 6 * node] = 0.0;
        metric[2 + 6 * node] = 0.0;
        metric[3 + 6 * node] = 1.0 / hmax / hmax;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0 / hmax / hmax;
      }
    }
  }

  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_node_owned(ref_node, node)) {
      face = ref_geom_id(ref_geom, geom) - 1;
      RSS(ref_geom_radian_request(ref_geom, geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      if (ref_geom_model_loaded(ref_geom)) {
        RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s),
            REF_FAILURE, "curve");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_face_curvature(ref_grid, geom, &kr, r, &ks, s),
            "curve");
      } else {
        continue;
      }
      /* ignore sign, curvature is 1 / radius */
      kr = ABS(kr);
      ks = ABS(ks);
      /* limit the aspect ratio of the metric by reducing the largest radius */
      kr = MAX(kr, curvature_ratio * ks);
      ks = MAX(ks, curvature_ratio * kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;
      hs = hmax;
      if (1.0 / rlimit < ks) hs = delta_radian / ks;

      if (ref_geom_model_loaded(ref_geom)) {
        REF_BOOL usable;
        RSS(ref_geom_usable(ref_geom, geom, &usable), "useable curvature");
        if (!usable) continue;
        RSS(ref_geom_reliability(ref_geom, geom, &slop), "edge tol");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_gap(ref_grid, node, &slop), "edge tol");
        slop *= ref_geom_gap_protection(ref_geom);
      } else {
        slop = 1.0e-5 * hmax;
      }
      if (hr < slop || hs < slop) continue;
      if (0.0 < ref_geom_face_min_length(ref_geom, face)) {
        if (hr < ref_geom_face_min_length(ref_geom, face) ||
            hs < ref_geom_face_min_length(ref_geom, face))
          continue;
      }

      hn = hmax;
      if (0.0 < ref_geom_face_initial_cell_height(ref_geom, face))
        hn = ref_geom_face_initial_cell_height(ref_geom, face);
      hn = MIN(hn, norm_ratio * hr);
      hn = MIN(hn, norm_ratio * hs);

      /* cross the tangent vectors to get the (inward or outward) normal */
      ref_math_cross_product(r, s, n);
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 0) = r[i];
      ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 1) = s[i];
      ref_matrix_eig(diagonal_system, 1) = 1.0 / hs / hs;
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 2) = n[i];
      ref_matrix_eig(diagonal_system, 2) = 1.0 / hn / hn;
      /* form and intersect with previous */
      RSS(ref_matrix_form_m(diagonal_system, curvature_metric), "reform m");
      for (i = 0; i < 6; i++) previous_metric[i] = metric[i + 6 * node];
      RSS(ref_matrix_intersect(previous_metric, curvature_metric,
                               &(metric[6 * node])),
          "intersect to update metric");
    }
  }

  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_geom_radian_request(ref_geom, geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_egads_edge_curvature(ref_geom, geom, &kr, r), "curve");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_edge_curvature(ref_grid, geom, &kr, r), "curve");
      } else {
        continue;
      }
      /* ignore sign, curvature is 1 / radius */
      kr = ABS(kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;

      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_geom_reliability(ref_geom, geom, &slop), "edge tol");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_gap(ref_grid, node, &slop), "edge tol");
        slop *= ref_geom_gap_protection(ref_geom);
      } else {
        slop = 1.0e-5 * hmax;
      }
      if (hr < slop) continue;

      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_geom_crease(ref_grid, node, &crease_dot_prod), "crease");
        if (crease_dot_prod < -0.8) {
          ramp = (-crease_dot_prod - 0.8) / 0.2;
          scale = 0.25 * ramp + 1.0 * (1.0 - ramp);
          hr *= scale;
        }
      }

      ref_matrix_vec(diagonal_system, 0, 0) = 1.0;
      ref_matrix_vec(diagonal_system, 1, 0) = 0.0;
      ref_matrix_vec(diagonal_system, 2, 0) = 0.0;
      ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;

      ref_matrix_vec(diagonal_system, 0, 1) = 0.0;
      ref_matrix_vec(diagonal_system, 1, 1) = 1.0;
      ref_matrix_vec(diagonal_system, 2, 1) = 0.0;
      ref_matrix_eig(diagonal_system, 1) = 1.0 / hr / hr;

      ref_matrix_vec(diagonal_system, 0, 2) = 0.0;
      ref_matrix_vec(diagonal_system, 1, 2) = 0.0;
      ref_matrix_vec(diagonal_system, 2, 2) = 1.0;
      ref_matrix_eig(diagonal_system, 2) = 1.0 / hr / hr;

      /* form and intersect with previous */
      RSS(ref_matrix_form_m(diagonal_system, curvature_metric), "reform m");
      for (i = 0; i < 6; i++) previous_metric[i] = metric[i + 6 * node];
      RSS(ref_matrix_intersect(previous_metric, curvature_metric,
                               &(metric[6 * node])),
          "intersect to update metric");
    }
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        RSS(ref_matrix_twod_m(&(metric[6 * node])), "enforce twod");
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}